

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicornafl.cpp
# Opt level: O0

void __thiscall
UCAFL::_uc_hook_cmpcov(UCAFL *this,uint64_t cur_loc,uint64_t arg1,uint64_t arg2,uint32_t size)

{
  uint32_t size_local;
  uint64_t arg2_local;
  uint64_t arg1_local;
  uint64_t cur_loc_local;
  UCAFL *this_local;
  
  arg1_local = cur_loc;
  if (size < 0x40) {
    if (size < 0x20) {
      if (0x10000 - cur_loc < 2) {
        arg1_local = cur_loc - 2;
      }
      _uc_hook_sub_impl_16(this,arg1_local,arg1,arg2);
    }
    else {
      if (0x10000 - cur_loc < 4) {
        arg1_local = cur_loc - 4;
      }
      _uc_hook_sub_impl_32(this,arg1_local,arg1,arg2);
    }
  }
  else {
    if (0x10000 - cur_loc < 8) {
      arg1_local = cur_loc - 8;
    }
    _uc_hook_sub_impl_64(this,arg1_local,arg1,arg2);
  }
  return;
}

Assistant:

void _uc_hook_cmpcov(uint64_t cur_loc, uint64_t arg1, uint64_t arg2, uint32_t size) {
        if (size >= 64) {
            if (unlikely(MAP_SIZE - cur_loc < 8))
                cur_loc -= 8;
            this->_uc_hook_sub_impl_64(cur_loc, arg1, arg2);
        } else if (size >= 32) {
            if (unlikely(MAP_SIZE - cur_loc < 4))
                cur_loc -= 4;
            this->_uc_hook_sub_impl_32(cur_loc, arg1, arg2);
        } else {
            if (unlikely(MAP_SIZE - cur_loc < 2))
                cur_loc -= 2;
            this->_uc_hook_sub_impl_16(cur_loc, arg1, arg2);
        }
    }